

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

string * __thiscall
kratos::GeneratorConst::to_string_abi_cxx11_(string *__return_storage_ptr__,GeneratorConst *this)

{
  Generator *pGVar1;
  pointer pcVar2;
  
  pGVar1 = this->gen_;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pGVar1->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pGVar1->name)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratorConst::to_string() const { return gen_.name; }